

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::UpsampleLayerParams::SerializeWithCachedSizes
          (UpsampleLayerParams *this,CodedOutputStream *output)

{
  Rep *pRVar1;
  uint64 value;
  int index;
  float *a;
  int iVar2;
  
  iVar2 = (this->scalingfactor_).current_size_;
  if (0 < iVar2) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,10);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_scalingfactor_cached_byte_size_);
    iVar2 = (this->scalingfactor_).current_size_;
  }
  index = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
    index = 0;
  }
  for (; iVar2 != index; index = index + 1) {
    value = scalingfactor(this,index);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,value);
  }
  if (this->mode_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(5,this->mode_,output);
  }
  if (this->linearupsamplemode_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(6,this->linearupsamplemode_,output);
  }
  if (0 < (this->fractionalscalingfactor_).current_size_) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x3a);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_fractionalscalingfactor_cached_byte_size_);
    pRVar1 = (this->fractionalscalingfactor_).rep_;
    a = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      a = (float *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteFloatArray
              (a,(this->fractionalscalingfactor_).current_size_,output);
    return;
  }
  return;
}

Assistant:

void UpsampleLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.UpsampleLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 scalingFactor = 1;
  if (this->scalingfactor_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_scalingfactor_cached_byte_size_);
  }
  for (int i = 0, n = this->scalingfactor_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->scalingfactor(i), output);
  }

  // .CoreML.Specification.UpsampleLayerParams.InterpolationMode mode = 5;
  if (this->mode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      5, this->mode(), output);
  }

  // .CoreML.Specification.UpsampleLayerParams.LinearUpsampleMode linearUpsampleMode = 6;
  if (this->linearupsamplemode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      6, this->linearupsamplemode(), output);
  }

  // repeated float fractionalScalingFactor = 7;
  if (this->fractionalscalingfactor_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(7, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_fractionalscalingfactor_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->fractionalscalingfactor().data(), this->fractionalscalingfactor_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.UpsampleLayerParams)
}